

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

void __thiscall
wasm::ShellExternalInterface::ShellExternalInterface
          (ShellExternalInterface *this,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_ExternalInterface)._vptr_ExternalInterface =
       (_func_int **)&PTR__ExternalInterface_0021eac0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~_Rb_tree(&local_48);
  (this->super_ExternalInterface)._vptr_ExternalInterface =
       (_func_int **)&PTR__ShellExternalInterface_0021e9c0;
  p_Var1 = &(this->memories)._M_t._M_impl.super__Rb_tree_header;
  (this->memories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->memories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->memories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->memories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->memories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tables)._M_h._M_buckets = &(this->tables)._M_h._M_single_bucket;
  (this->tables)._M_h._M_bucket_count = 1;
  (this->tables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tables)._M_h._M_element_count = 0;
  (this->tables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header;
  (this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::swap(&(this->linkedInstances)._M_t,&linkedInstances_->_M_t);
  return;
}

Assistant:

ShellExternalInterface(
    std::map<Name, std::shared_ptr<ModuleRunner>> linkedInstances_ = {}) {
    linkedInstances.swap(linkedInstances_);
  }